

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

void Image_Function_Helper::Resize(ResizeForm4 resize,Image *in,Image *out)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  (*resize)(in,0,0,in->_width,in->_height,out,0,0,out->_width,out->_height);
  return;
}

Assistant:

void Resize( FunctionTable::ResizeForm4 resize,
                 const Image & in, Image & out )
    {
        Image_Function::ParameterValidation( in );
        Image_Function::ParameterValidation( out );

        resize( in, 0, 0, in.width(), in.height(), out, 0, 0, out.width(), out.height() );
    }